

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O0

void google::DumpPCAndSymbol(DebugWriter *writerfn,void *arg,void *pc,char *prefix)

{
  bool bVar1;
  char local_838 [8];
  char buf [1024];
  char **local_430;
  char *symbol;
  char tmp [1024];
  char *prefix_local;
  void *pc_local;
  void *arg_local;
  DebugWriter *writerfn_local;
  
  local_430 = (char **)0x147afa;
  tmp._1016_8_ = prefix;
  bVar1 = Symbolize((void *)((long)pc + -1),(char *)&symbol,0x400);
  if (bVar1) {
    local_430 = &symbol;
  }
  snprintf(local_838,0x400,"%s@ %*p  %s\n",tmp._1016_8_,0x12,pc,local_430);
  (*writerfn)(local_838,arg);
  return;
}

Assistant:

static void DumpPCAndSymbol(DebugWriter *writerfn, void *arg, void *pc,
                            const char * const prefix) {
  char tmp[1024];
  const char *symbol = "(unknown)";
  // Symbolizes the previous address of pc because pc may be in the
  // next function.  The overrun happens when the function ends with
  // a call to a function annotated noreturn (e.g. CHECK).
  if (Symbolize(reinterpret_cast<char *>(pc) - 1, tmp, sizeof(tmp))) {
      symbol = tmp;
  }
  char buf[1024];
  snprintf(buf, sizeof(buf), "%s@ %*p  %s\n",
           prefix, kPrintfPointerFieldWidth, pc, symbol);
  writerfn(buf, arg);
}